

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

int wait_until_io_stream_ready(pa_stream *stream,pa_threaded_mainloop *mainloop)

{
  pa_stream_state_t pVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  if (mainloop != (pa_threaded_mainloop *)0x0) {
    do {
      pVar1 = (*cubeb_pa_stream_get_state)(stream);
      iVar2 = 1;
      if ((0xfffffffd < pVar1 - PA_STREAM_FAILED) && (iVar2 = 2, pVar1 != PA_STREAM_READY)) {
        (*cubeb_pa_threaded_mainloop_wait)(mainloop);
        iVar2 = 0;
      }
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
wait_until_io_stream_ready(pa_stream * stream, pa_threaded_mainloop * mainloop)
{
  if (!stream || !mainloop) {
    return -1;
  }
  for (;;) {
    pa_stream_state_t state = WRAP(pa_stream_get_state)(stream);
    if (!PA_STREAM_IS_GOOD(state))
      return -1;
    if (state == PA_STREAM_READY)
      break;
    WRAP(pa_threaded_mainloop_wait)(mainloop);
  }
  return 0;
}